

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O1

EGLConfig deqp::egl::Image::chooseConfig(Library *egl,EGLDisplay display,ApiType apiType)

{
  EGLenum EVar1;
  pointer ppvVar2;
  pointer ppvVar3;
  EGLint EVar4;
  mapped_type_conflict *pmVar5;
  EGLenum *pEVar6;
  NotSupportedError *this;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  ulong uVar8;
  pointer ppvVar9;
  pointer ppvVar10;
  ulong uVar11;
  EGLenum *pEVar12;
  pointer ppvVar13;
  AttribMap attribs;
  vector<void_*,_std::allocator<void_*>_> local_98;
  ulong local_80;
  Library *local_78;
  EGLDisplay local_70;
  ulong local_68;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = egl;
  local_70 = display;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  EVar4 = eglu::apiRenderableType(apiType);
  local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0x3040);
  pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_60,(key_type_conflict *)&local_98);
  *pmVar5 = EVar4;
  pEVar12 = chooseConfig::s_surfaceTypes;
  uVar11 = 0;
  uVar8 = 0;
  ppvVar9 = (pointer)0x0;
  ppvVar10 = (pointer)0x0;
  while( true ) {
    EVar1 = *pEVar12;
    local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_98.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x3033);
    local_80 = uVar8;
    local_68 = uVar11;
    pEVar6 = (EGLenum *)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_60,(key_type_conflict *)&local_98);
    *pEVar6 = EVar1;
    eglu::chooseConfigs(&local_98,local_78,local_70,(AttribMap *)&local_60);
    ppvVar3 = local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppvVar13 = local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppvVar2 = local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uVar7 = extraout_RDX;
    if (ppvVar9 != (pointer)0x0) {
      operator_delete(ppvVar9,(long)ppvVar10 - (long)ppvVar9);
      uVar7 = extraout_RDX_00;
    }
    if (local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
      uVar7 = extraout_RDX_01;
    }
    if (ppvVar2 != ppvVar13) break;
    uVar11 = local_68 + 1;
    uVar8 = CONCAT71((int7)((ulong)uVar7 >> 8),1 < local_68);
    pEVar12 = pEVar12 + 1;
    ppvVar9 = ppvVar2;
    ppvVar10 = ppvVar3;
    if (uVar11 == 3) {
LAB_00e69b5f:
      if ((uVar8 & 1) != 0) {
        this = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this,"No compatible EGL configs found",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                   ,0xf0);
        __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      if (ppvVar2 != (pointer)0x0) {
        operator_delete(ppvVar2,(long)ppvVar3 - (long)ppvVar2);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_60);
      return ppvVar13;
    }
  }
  ppvVar13 = (pointer)*ppvVar2;
  uVar8 = local_80;
  goto LAB_00e69b5f;
}

Assistant:

EGLConfig chooseConfig (const Library& egl, EGLDisplay display, ApiType apiType)
{
	AttribMap				attribs;
	vector<EGLConfig>		configs;
	// Prefer configs in order: pbuffer, window, pixmap
	static const EGLenum	s_surfaceTypes[] = { EGL_PBUFFER_BIT, EGL_WINDOW_BIT, EGL_PIXMAP_BIT };

	attribs[EGL_RENDERABLE_TYPE] = eglu::apiRenderableType(apiType);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_surfaceTypes); ++ndx)
	{
		attribs[EGL_SURFACE_TYPE] = s_surfaceTypes[ndx];
		configs = eglu::chooseConfigs(egl, display, attribs);

		if (!configs.empty())
			return configs.front();
	}

	TCU_THROW(NotSupportedError, "No compatible EGL configs found");
	return (EGLConfig)0;
}